

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

void mp_clamp(mp_int *a)

{
  uint uVar1;
  
  uVar1 = a->used;
  while (0 < (int)uVar1) {
    if (a->dp[(ulong)uVar1 - 1] != 0) {
      return;
    }
    uVar1 = uVar1 - 1;
    a->used = uVar1;
  }
  if (uVar1 != 0) {
    return;
  }
  a->sign = 0;
  return;
}

Assistant:

void mp_clamp (mp_int * a)
{
  /* decrease used while the most significant digit is
   * zero.
   */
  while (a->used > 0 && a->dp[a->used - 1] == 0) {
    --(a->used);
  }

  /* reset the sign flag if used == 0 */
  if (a->used == 0) {
    a->sign = MP_ZPOS;
  }
}